

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::ConsoleReporter(ConsoleReporter *this,ReporterConfig *config)

{
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *this_00;
  pointer __p;
  ReporterConfig *in_RSI;
  unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_> *in_RDI;
  ReporterConfig *in_stack_00000068;
  StreamingReporterBase<Catch::ConsoleReporter> *in_stack_00000070;
  anon_class_8_1_50637480 *in_stack_00000258;
  ostream *in_stack_ffffffffffffffc8;
  TablePrinter *in_stack_ffffffffffffffd0;
  
  StreamingReporterBase<Catch::ConsoleReporter>::StreamingReporterBase
            (in_stack_00000070,in_stack_00000068);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>._M_t.
  super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
  super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl =
       (TablePrinter *)&PTR__ConsoleReporter_00277f98;
  this_00 = (vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             *)operator_new(0x1a0);
  __p = (pointer)ReporterConfig::stream(in_RSI);
  ConsoleReporter::anon_class_8_1_50637480::operator()(in_stack_00000258);
  TablePrinter::TablePrinter
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
              *)in_RSI);
  std::unique_ptr<Catch::TablePrinter,std::default_delete<Catch::TablePrinter>>::
  unique_ptr<std::default_delete<Catch::TablePrinter>,void>(in_RDI,__p);
  clara::std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector(this_00);
  *(undefined1 *)
   &in_RDI[0x2e]._M_t.
    super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>._M_t.
    super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
    super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl = 0;
  return;
}

Assistant:

ConsoleReporter::ConsoleReporter(ReporterConfig const& config)
    : StreamingReporterBase(config),
    m_tablePrinter(new TablePrinter(config.stream(),
        [&config]() -> std::vector<ColumnInfo> {
        if (config.fullConfig()->benchmarkNoAnalysis())
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, ColumnInfo::Left },
                { "     samples", 14, ColumnInfo::Right },
                { "  iterations", 14, ColumnInfo::Right },
                { "        mean", 14, ColumnInfo::Right }
            };
        }
        else
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, ColumnInfo::Left },
                { "samples      mean       std dev", 14, ColumnInfo::Right },
                { "iterations   low mean   low std dev", 14, ColumnInfo::Right },
                { "estimated    high mean  high std dev", 14, ColumnInfo::Right }
            };
        }
    }())) {}